

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_rpm.c
# Opt level: O0

int rpm_bidder_init(archive_read_filter *self)

{
  void *pvVar1;
  long in_RDI;
  rpm *rpm;
  int local_4;
  
  *(undefined4 *)(in_RDI + 0x60) = 8;
  *(char **)(in_RDI + 0x58) = "rpm";
  *(code **)(in_RDI + 0x28) = rpm_filter_read;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(code **)(in_RDI + 0x40) = rpm_filter_close;
  pvVar1 = calloc(0x30,1);
  if (pvVar1 == (void *)0x0) {
    archive_set_error(*(archive **)(in_RDI + 0x18),0xc,"Can\'t allocate data for rpm");
    local_4 = -0x1e;
  }
  else {
    *(void **)(in_RDI + 0x50) = pvVar1;
    *(undefined4 *)((long)pvVar1 + 0x28) = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
rpm_bidder_init(struct archive_read_filter *self)
{
	struct rpm   *rpm;

	self->code = ARCHIVE_FILTER_RPM;
	self->name = "rpm";
	self->read = rpm_filter_read;
	self->skip = NULL; /* not supported */
	self->close = rpm_filter_close;

	rpm = (struct rpm *)calloc(sizeof(*rpm), 1);
	if (rpm == NULL) {
		archive_set_error(&self->archive->archive, ENOMEM,
		    "Can't allocate data for rpm");
		return (ARCHIVE_FATAL);
	}

	self->data = rpm;
	rpm->state = ST_LEAD;

	return (ARCHIVE_OK);
}